

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O1

void __thiscall ThreadPoolTest_push_Test::TestBody(ThreadPoolTest_push_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  long lVar2;
  AssertionResult gtest_ar;
  atomic<unsigned_long> iterations;
  thread_pool pool;
  long *local_1a8;
  AssertHelper local_1a0 [8];
  internal local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  atomic<unsigned_long> *local_188;
  undefined8 uStack_180;
  code *local_178;
  code *pcStack_170;
  atomic<unsigned_long> local_168;
  thread_pool local_160 [304];
  
  local_168.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  jessilib::thread_pool::thread_pool(local_160);
  lVar2 = 100;
  do {
    uStack_180 = 0;
    pcStack_170 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp:60:13)>
                  ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp:60:13)>
                ::_M_manager;
    local_188 = &local_168;
    jessilib::thread_pool::push(local_160,&local_188);
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,3);
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  jessilib::thread_pool::join();
  testing::internal::CmpHelperEQ<std::atomic<unsigned_long>,unsigned_long>
            (local_198,"iterations","total_iterations",&local_168,&total_iterations);
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_190 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_190->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/thread_pool.cpp"
               ,0x42,pcVar1);
    testing::internal::AssertHelper::operator=(local_1a0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(local_1a0);
    if (local_1a8 != (long *)0x0) {
      (**(code **)(*local_1a8 + 8))();
    }
  }
  if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_190,local_190);
  }
  jessilib::thread_pool::~thread_pool(local_160);
  return;
}

Assistant:

TEST(ThreadPoolTest, push) {
	std::atomic<size_t> iterations{0};
	thread_pool pool;

	repeat (total_iterations) {
		pool.push([&iterations]() {
			++iterations;
		});
	}

	pool.join();
	EXPECT_EQ(iterations, total_iterations);
}